

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ToNumberHintFree(JSContext *ctx,JSValue val,JSToNumberHintEnum flag)

{
  JSValue JVar1;
  JSValue JVar2;
  JSValue JVar3;
  JSValue JVar4;
  JSValue JVar5;
  JSValue JVar6;
  JSValue JVar7;
  int iVar8;
  char *pc;
  JSRefCountHeader *p;
  JSValueUnion JVar9;
  uint uVar10;
  JSValue JVar11;
  size_t len;
  char *local_40;
  size_t local_38;
  
  do {
    JVar9 = val.u;
    uVar10 = (uint)val.tag;
    if (uVar10 != 0xffffffff) {
      switch(uVar10) {
      case 0:
      case 6:
      case 7:
        return val;
      case 1:
      case 2:
        JVar4.tag = 0;
        JVar4.u.ptr = (void *)((ulong)JVar9.ptr & 0xffffffff);
        return JVar4;
      case 3:
        JVar11.tag = 7;
        JVar11.u.float64 = NAN;
        return JVar11;
      case 0xfffffff8:
        iVar8 = *JVar9.ptr;
        *(int *)JVar9.ptr = iVar8 + -1;
        if (iVar8 < 2) {
          __JS_FreeValueRT(ctx->rt,val);
        }
        JS_ThrowTypeError(ctx,"cannot convert symbol to number");
        break;
      case 0xfffffff9:
        pc = JS_ToCStringLen2(ctx,&local_38,val,0);
        iVar8 = *JVar9.ptr;
        *(int *)JVar9.ptr = iVar8 + -1;
        if (iVar8 < 2) {
          __JS_FreeValueRT(ctx->rt,val);
        }
        if (pc != (char *)0x0) {
          iVar8 = skip_spaces(pc);
          local_40 = pc + iVar8;
          if (local_38 == (long)iVar8) {
            JVar5 = (JSValue)ZEXT816(0);
          }
          else {
            JVar11 = js_atof(ctx,local_40,&local_40,0,4);
            JVar5 = JVar11;
            if ((uint)JVar11.tag != 6) {
              iVar8 = skip_spaces(local_40);
              local_40 = local_40 + iVar8;
              if ((long)local_40 - (long)pc != local_38) {
                JVar7.tag = 7;
                JVar7.u.float64 = NAN;
                JVar6.tag = 7;
                JVar6.u.float64 = NAN;
                JVar5.tag = 7;
                JVar5.u.float64 = NAN;
                if ((0xfffffff4 < (uint)JVar11.tag) &&
                   (iVar8 = *JVar11.u.ptr, *(int *)JVar11.u.ptr = iVar8 + -1, JVar5 = JVar6,
                   iVar8 < 2)) {
                  __JS_FreeValueRT(ctx->rt,JVar11);
                  JVar5 = JVar7;
                }
              }
            }
          }
          JS_FreeCString(ctx,pc);
          return JVar5;
        }
        return (JSValue)(ZEXT816(6) << 0x40);
      default:
        JVar3.tag = 7;
        JVar3.u.float64 = NAN;
        JVar2.tag = 7;
        JVar2.u.float64 = NAN;
        JVar1.tag = 7;
        JVar1.u.float64 = NAN;
        if (uVar10 < 0xfffffff5) {
          return JVar1;
        }
        iVar8 = *JVar9.ptr;
        *(int *)JVar9.ptr = iVar8 + -1;
        if (1 < iVar8) {
          return JVar2;
        }
        __JS_FreeValueRT(ctx->rt,val);
        return JVar3;
      }
      break;
    }
    val = JS_ToPrimitiveFree(ctx,val,1);
  } while ((int)val.tag != 6);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue JS_ToNumberHintFree(JSContext *ctx, JSValue val,
                                   JSToNumberHintEnum flag)
{
    uint32_t tag;
    JSValue ret;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_DECIMAL:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigdecimal to number");
        }
        ret = val;
        break;
    case JS_TAG_BIG_INT:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigint to number");
        }
        ret = val;
        break;
    case JS_TAG_BIG_FLOAT:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigfloat to number");
        }
        ret = val;
        break;
#endif
    case JS_TAG_FLOAT64:
    case JS_TAG_INT:
    case JS_TAG_EXCEPTION:
        ret = val;
        break;
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
        ret = JS_NewInt32(ctx, JS_VALUE_GET_INT(val));
        break;
    case JS_TAG_UNDEFINED:
        ret = JS_NAN;
        break;
    case JS_TAG_OBJECT:
        val = JS_ToPrimitiveFree(ctx, val, HINT_NUMBER);
        if (JS_IsException(val))
            return JS_EXCEPTION;
        goto redo;
    case JS_TAG_STRING:
        {
            const char *str;
            const char *p;
            size_t len;
            
            str = JS_ToCStringLen(ctx, &len, val);
            JS_FreeValue(ctx, val);
            if (!str)
                return JS_EXCEPTION;
            p = str;
            p += skip_spaces(p);
            if ((p - str) == len) {
                ret = JS_NewInt32(ctx, 0);
            } else {
                int flags = ATOD_ACCEPT_BIN_OCT;
                ret = js_atof(ctx, p, &p, 0, flags);
                if (!JS_IsException(ret)) {
                    p += skip_spaces(p);
                    if ((p - str) != len) {
                        JS_FreeValue(ctx, ret);
                        ret = JS_NAN;
                    }
                }
            }
            JS_FreeCString(ctx, str);
        }
        break;
    case JS_TAG_SYMBOL:
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeError(ctx, "cannot convert symbol to number");
    default:
        JS_FreeValue(ctx, val);
        ret = JS_NAN;
        break;
    }
    return ret;
}